

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL> *
__thiscall
spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::
get_extra_required_extension_names_abi_cxx11_
          (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
           *__return_storage_ptr__,ShaderSubgroupSupportHelper *this,Candidate c)

{
  char *pcVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((int)this == 8) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"GL_AMD_gpu_shader_int64","");
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"GL_NV_gpu_shader5","");
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::SmallVector(__return_storage_ptr__,&local_60,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &stack0xffffffffffffffe0);
    lVar2 = 0;
    do {
      pcVar1 = *(char **)((long)&local_40._M_dataplus._M_p + lVar2);
      if (local_40.field_2._M_local_buf + lVar2 != pcVar1) {
        operator_delete(pcVar1);
      }
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x40);
  }
  else if ((int)this == 6) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"GL_ARB_shader_int64","");
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::SmallVector(__return_storage_ptr__,&local_60,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  else {
    (__return_storage_ptr__->
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    (__return_storage_ptr__->
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).buffer_size = 0;
    (__return_storage_ptr__->
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &__return_storage_ptr__->stack_storage;
    __return_storage_ptr__->buffer_capacity = 8;
  }
  return __return_storage_ptr__;
}

Assistant:

SmallVector<std::string> CompilerGLSL::ShaderSubgroupSupportHelper::get_extra_required_extension_names(Candidate c)
{
	switch (c)
	{
	case ARB_shader_ballot:
		return { "GL_ARB_shader_int64" };
	case AMD_gcn_shader:
		return { "GL_AMD_gpu_shader_int64", "GL_NV_gpu_shader5" };
	default:
		return {};
	}
}